

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcVibrationIsolatorType,_1UL>::
         Construct(DB *db,LIST *params)

{
  IfcVibrationIsolatorType *this;
  
  this = (IfcVibrationIsolatorType *)operator_new(0x1e8);
  Assimp::IFC::Schema_2x3::IfcVibrationIsolatorType::IfcVibrationIsolatorType(this);
  GenericFill<Assimp::IFC::Schema_2x3::IfcVibrationIsolatorType>(db,params,this);
  return (Object *)
         (&(this->super_IfcDiscreteAccessoryType).super_IfcElementComponentType.super_IfcElementType
           .super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
         *(long *)(*(long *)&(this->super_IfcDiscreteAccessoryType).super_IfcElementComponentType.
                             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject + -0x18))
  ;
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }